

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O1

void __thiscall
TempTracker<ObjectTempVerify>::ProcessUse
          (TempTracker<ObjectTempVerify> *this,StackSym *sym,BackwardPass *backwardPass)

{
  uint i;
  uint dstSymID;
  Instr *instr;
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  BVSparse<Memory::JitArenaAllocator> **ppBVar6;
  char16_t *pcVar7;
  char16_t *pcVar8;
  
  if (sym->m_type == TyVar) {
    instr = backwardPass->currentInstr;
    i = (sym->super_Sym).m_id;
    bVar2 = ObjectTempVerify::IsTempUse(instr,&sym->super_Sym,backwardPass);
    if (!bVar2) {
      BVSparse<Memory::JitArenaAllocator>::Set((BVSparse<Memory::JitArenaAllocator> *)this,i);
    }
    bVar3 = ObjectTempVerify::DoTrace(backwardPass);
    if (bVar3) {
      pcVar8 = L"Prepass ";
      if (backwardPass->currentPrePassLoop == (Loop *)0x0) {
        pcVar8 = L"";
      }
      pcVar7 = L"Non ";
      if (bVar2) {
        pcVar7 = L"";
      }
      Output::Print(L"%s: %8s%4sTemp Use (s%-3d): ",L"MarkTempObjectVerify",pcVar8,pcVar7,(ulong)i);
      IR::Instr::DumpSimple(instr);
      Output::Flush();
    }
    bVar2 = ObjectTempVerify::IsTempTransfer(instr);
    if (bVar2) {
      BVSparse<Memory::JitArenaAllocator>::Set
                (&(this->super_ObjectTempVerify).super_TempTrackerBase.tempTransferredSyms,i);
      if ((this->super_ObjectTempVerify).super_TempTrackerBase.tempTransferDependencies !=
          (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0) {
        this_00 = instr->m_dst;
        OVar4 = IR::Opnd::GetKind(this_00);
        if (OVar4 == OpndKindReg) {
          OVar4 = IR::Opnd::GetKind(this_00);
          if (OVar4 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar5 = 0;
          }
          dstSymID = *(uint *)(this_00[1]._vptr_Opnd + 2);
          if (dstSymID != i) {
            TempTrackerBase::AddTransferDependencies
                      ((TempTrackerBase *)this,i,dstSymID,
                       (this->super_ObjectTempVerify).super_TempTrackerBase.tempTransferDependencies
                      );
            bVar2 = ObjectTempVerify::DoTrace(backwardPass);
            if (bVar2) {
              pcVar8 = L"Prepass ";
              if (backwardPass->currentPrePassLoop == (Loop *)0x0) {
                pcVar8 = L"";
              }
              Output::Print(L"%s: %8s s%d -> s%d: ",L"MarkTempObjectVerify",pcVar8,(ulong)dstSymID,
                            (ulong)i);
              ppBVar6 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::
                        Get((this->super_ObjectTempVerify).super_TempTrackerBase.
                            tempTransferDependencies,i);
              BVSparse<Memory::JitArenaAllocator>::Dump(*ppBVar6);
              return;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
TempTracker<T>::ProcessUse(StackSym * sym, BackwardPass * backwardPass)
{
    // Don't care about type specialized syms
    if (!sym->IsVar())
    {
        return;
    }
    IR::Instr * instr = backwardPass->currentInstr;
    SymID usedSymID = sym->m_id;
    bool isTempPropertyTransferStore = T::IsTempPropertyTransferStore(instr, backwardPass);
    bool isTempUse = isTempPropertyTransferStore || T::IsTempUse(instr, sym, backwardPass);
    if (!isTempUse)
    {
        this->nonTempSyms.Set(usedSymID);
    }
#if DBG
    if (T::DoTrace(backwardPass))
    {
        Output::Print(_u("%s: %8s%4sTemp Use (s%-3d): "), T::GetTraceName(),
            backwardPass->IsPrePass() ? _u("Prepass ") : _u(""), isTempUse ? _u("") : _u("Non "), usedSymID);
        instr->DumpSimple();
        Output::Flush();
    }
#endif
    if (T::IsTempTransfer(instr))
    {
        this->tempTransferredSyms.Set(usedSymID);

        // Track dependencies if we are in loop only
        if (this->tempTransferDependencies != nullptr)
        {
            IR::Opnd * dstOpnd = instr->GetDst();
            if (dstOpnd->IsRegOpnd())
            {
                SymID dstSymID = dstOpnd->AsRegOpnd()->m_sym->m_id;

                if (dstSymID != usedSymID)
                {
                    // Record that the usedSymID may propagate to dstSymID and all the symbols
                    // that it may propagate to as well
                    this->AddTransferDependencies(usedSymID, dstSymID, this->tempTransferDependencies);
#if DBG_DUMP
                    if (T::DoTrace(backwardPass))
                    {
                        Output::Print(_u("%s: %8s s%d -> s%d: "), T::GetTraceName(),
                            backwardPass->IsPrePass() ? _u("Prepass ") : _u(""), dstSymID, usedSymID);
                        (*this->tempTransferDependencies->Get(usedSymID))->Dump();
                    }
#endif
                }
            }
        }
    }

    if (isTempPropertyTransferStore)
    {
        this->tempTransferredSyms.Set(usedSymID);
        PropertySym * propertySym = instr->GetDst()->AsSymOpnd()->m_sym->AsPropertySym();
        this->PropagateTempPropertyTransferStoreDependencies(usedSymID, propertySym, backwardPass);

#if DBG_DUMP
        if (T::DoTrace(backwardPass) && this->tempTransferDependencies)
        {
            Output::Print(_u("%s: %8s (PropId:%d)+[] -> s%d: "), T::GetTraceName(),
                backwardPass->IsPrePass() ? _u("Prepass ") : _u(""), propertySym->m_propertyId, usedSymID);
            BVSparse<JitArenaAllocator> ** transferDependencies = this->tempTransferDependencies->Get(usedSymID);
            if (transferDependencies)
            {
                (*transferDependencies)->Dump();
            }
            else
            {
                Output::Print(_u("[]\n"));
            }
        }
#endif
    }
}